

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

Cluster * __thiscall mkvparser::Segment::GetNext(Segment *this,Cluster *pCurr)

{
  Cluster **ppCVar1;
  uint uVar2;
  longlong lVar3;
  longlong lVar4;
  Cluster *pCVar5;
  long lVar6;
  long lVar7;
  long pos;
  bool bVar8;
  long len;
  long len_;
  longlong pos_;
  long local_58;
  Segment *local_50;
  long local_48;
  long local_40;
  longlong local_38;
  
  if (pCurr == (Cluster *)0x0) {
    __assert_fail("pCurr",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9de,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  pCVar5 = &this->m_eos;
  if (pCVar5 == pCurr) {
    __assert_fail("pCurr != &m_eos",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9df,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  ppCVar1 = this->m_clusters;
  if (ppCVar1 == (Cluster **)0x0) {
    __assert_fail("m_clusters",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9e0,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  lVar6 = pCurr->m_index;
  if (lVar6 < 0) {
    if (this->m_clusterPreloadCount < 1) {
      __assert_fail("m_clusterPreloadCount > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9f6,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (this->m_size < 0) {
      __assert_fail("m_size >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9fa,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    lVar6 = pCurr->m_element_start;
    lVar7 = this->m_size + this->m_start;
    lVar3 = GetUIntLength(this->m_pReader,lVar6,&local_58);
    if (lVar3 != 0) {
      __assert_fail("result == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa01,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (lVar7 < local_58 + lVar6) {
      __assert_fail("(pos + len) <= stop",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa02,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    lVar3 = ReadID(this->m_pReader,lVar6,&local_58);
    if (lVar3 == 0x1f43b675) {
      lVar6 = lVar6 + local_58;
      lVar4 = GetUIntLength(this->m_pReader,lVar6,&local_58);
      if (lVar4 != 0) {
        __assert_fail("result == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa0e,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      if (lVar7 < local_58 + lVar6) {
        __assert_fail("(pos + len) <= stop",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa0f,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      lVar4 = ReadUInt(this->m_pReader,lVar6,&local_58);
      if (lVar4 < 1) {
        __assert_fail("size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa12,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      lVar6 = lVar4 + lVar6 + local_58;
      if (lVar7 < lVar6) {
        __assert_fail("(pos + size) <= stop",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa16,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
    }
    if ((lVar3 == 0x1f43b675) && (lVar6 < lVar7)) {
      local_48 = 0;
      local_50 = this;
      lVar3 = GetUIntLength(this->m_pReader,lVar6,&local_58);
      if (lVar3 != 0) {
        __assert_fail("result == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa23,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      if (lVar7 < local_58 + lVar6) {
        __assert_fail("(pos + len) <= stop",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa24,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      lVar3 = ReadID(this->m_pReader,lVar6,&local_58);
      if (lVar3 < 0) {
        uVar2 = 1;
      }
      else {
        pos = local_58 + lVar6;
        lVar4 = GetUIntLength(this->m_pReader,pos,&local_58);
        if (lVar4 != 0) {
          __assert_fail("result == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa32,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        if (lVar7 < local_58 + pos) {
          __assert_fail("(pos + len) <= stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa33,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        lVar4 = ReadUInt(local_50->m_pReader,pos,&local_58);
        if (lVar4 < 0) {
          __assert_fail("size >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa36,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        if (lVar7 < pos + local_58 + lVar4) {
          __assert_fail("(pos + size) <= stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa39,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        if (lVar4 == 0) {
          uVar2 = 2;
        }
        else {
          uVar2 = 0;
          if (lVar3 == 0x1f43b675) {
            lVar6 = lVar6 - local_50->m_start;
            lVar7 = Cluster::HasBlockEntries(local_50,lVar6,&local_38,&local_40);
            bVar8 = lVar7 != 0;
            if (lVar7 < 0) {
              __assert_fail("status >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0xa48,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
            }
            if (bVar8) {
              local_48 = lVar6;
            }
            uVar2 = (uint)bVar8 + (uint)bVar8 * 2;
          }
        }
      }
      pCVar5 = (Cluster *)(*(code *)((long)&DAT_0011d780 + (long)(int)(&DAT_0011d780)[uVar2]))();
      return pCVar5;
    }
    pCVar5 = (Cluster *)0x0;
  }
  else {
    lVar7 = this->m_clusterCount;
    if (lVar7 < 1) {
      __assert_fail("m_clusterCount > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9e5,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (lVar7 <= lVar6) {
      __assert_fail("idx < m_clusterCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9e6,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (ppCVar1[lVar6] != pCurr) {
      __assert_fail("pCurr == m_clusters[idx]",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9e7,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (lVar6 + 1 < lVar7) {
      pCVar5 = ppCVar1[lVar6 + 1];
      if (pCVar5 == (Cluster *)0x0) {
        __assert_fail("pNext",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x9ef,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      if (pCVar5->m_index < 0) {
        __assert_fail("pNext->m_index >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x9f0,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      if (pCVar5->m_index != lVar6 + 1) {
        __assert_fail("pNext->m_index == idx",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x9f1,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
    }
  }
  return pCVar5;
}

Assistant:

const Cluster* Segment::GetNext(const Cluster* pCurr) {
  assert(pCurr);
  assert(pCurr != &m_eos);
  assert(m_clusters);

  long idx = pCurr->m_index;

  if (idx >= 0) {
    assert(m_clusterCount > 0);
    assert(idx < m_clusterCount);
    assert(pCurr == m_clusters[idx]);

    ++idx;

    if (idx >= m_clusterCount)
      return &m_eos;  // caller will LoadCluster as desired

    Cluster* const pNext = m_clusters[idx];
    assert(pNext);
    assert(pNext->m_index >= 0);
    assert(pNext->m_index == idx);

    return pNext;
  }

  assert(m_clusterPreloadCount > 0);

  long long pos = pCurr->m_element_start;

  assert(m_size >= 0);  // TODO
  const long long stop = m_start + m_size;  // end of segment

  {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long id = ReadID(m_pReader, pos, len);
    if (id != libwebm::kMkvCluster)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size > 0);  // TODO
    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    pos += size;  // consume payload
  }

  long long off_next = 0;

  while (pos < stop) {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long idpos = pos;  // pos of next (potential) cluster

    const long long id = ReadID(m_pReader, idpos, len);
    if (id < 0)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size >= 0);  // TODO

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvCluster) {
      const long long off_next_ = idpos - m_start;

      long long pos_;
      long len_;

      const long status = Cluster::HasBlockEntries(this, off_next_, pos_, len_);

      assert(status >= 0);

      if (status > 0) {
        off_next = off_next_;
        break;
      }
    }

    pos += size;  // consume payload
  }

  if (off_next <= 0)
    return 0;

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    // const long long pos_ = pNext->m_pos;
    // assert(pos_);
    // pos = pos_ * ((pos_ < 0) ? -1 : 1);

    pos = pNext->GetPosition();

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else
      return pNext;
  }

  assert(i == j);

  Cluster* const pNext = Cluster::Create(this, -1, off_next);
  if (pNext == NULL)
    return NULL;

  const ptrdiff_t idx_next = i - m_clusters;  // insertion position

  if (!PreloadCluster(pNext, idx_next)) {
    delete pNext;
    return NULL;
  }
  assert(m_clusters);
  assert(idx_next < m_clusterSize);
  assert(m_clusters[idx_next] == pNext);

  return pNext;
}